

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_unitsEqualPrecision3_Test::TestBody(Equality_unitsEqualPrecision3_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_1e0 [2];
  AssertHelper local_1c0 [8];
  Message local_1b8 [8];
  shared_ptr<libcellml::Entity> local_1b0;
  bool local_199;
  undefined1 local_198 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_168 [8];
  Message local_160 [8];
  shared_ptr<libcellml::Entity> local_158;
  bool local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [32];
  undefined1 local_68 [8];
  UnitsPtr u2;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  UnitsPtr u1;
  Equality_unitsEqualPrecision3_Test *this_local;
  
  u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"unitsA",&local_41);
  libcellml::Units::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_88,"unitsA",&local_89);
  libcellml::Units::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_b0,"second",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"",&local_d9);
  libcellml::Units::addUnit((string *)peVar3,2.0000000000000004,local_b0);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"second",&local_101);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_128,"",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Units::addUnit((string *)peVar3,2.0,local_100);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Units,void>
            (&local_158,(shared_ptr<libcellml::Units> *)local_68);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_141 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_140,&local_141,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_158);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar2) {
    testing::Message::Message(local_160);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_140,"u1->equals(u2)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x178,pcVar4);
    testing::internal::AssertHelper::operator=(local_168,local_160);
    testing::internal::AssertHelper::~AssertHelper(local_168);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_160);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  peVar3 = std::__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Units,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_68);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Units,void>
            (&local_1b0,(shared_ptr<libcellml::Units> *)local_20);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_199 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_198,&local_199,(type *)0x0);
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_1b0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(local_1b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_1e0,local_198,"u2->equals(u1)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x179,pcVar4);
    testing::internal::AssertHelper::operator=(local_1c0,local_1b8);
    testing::internal::AssertHelper::~AssertHelper(local_1c0);
    std::__cxx11::string::~string((string *)local_1e0);
    testing::Message::~Message(local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_68);
  std::shared_ptr<libcellml::Units>::~shared_ptr((shared_ptr<libcellml::Units> *)local_20);
  return;
}

Assistant:

TEST(Equality, unitsEqualPrecision3)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 2.000000000000000444089209850062616169452667236328125);
    u2->addUnit("second", 2.0);

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}